

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

void Diligent::AssignShader(IShader **pDstShader,IShader *pSrcShader,SHADER_TYPE ExpectedType)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [49];
  char (*in_R8) [49];
  string msg;
  string local_48;
  Char *local_28;
  
  if (pSrcShader == (IShader *)0x0) {
    FormatString<char[26],char[22]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSrcShader != nullptr",(char (*) [22])in_RCX);
    in_RCX = (char (*) [49])0x132;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x132);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*(pSrcShader->super_IDeviceObject).super_IObject._vptr_IObject[4])(pSrcShader);
  if (*(SHADER_TYPE *)(CONCAT44(extraout_var,iVar1) + 8) != ExpectedType) {
    FormatString<char[26],char[49]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSrcShader->GetDesc().ShaderType == ExpectedType",in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x133);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (*pDstShader != (IShader *)0x0) {
    iVar1 = (*((*pDstShader)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_28 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_00,iVar1) + 8));
    FormatString<char[10],char_const*,char[49]>
              (&local_48,(Diligent *)"Non-null ",(char (*) [10])&local_28,
               (char **)" has already been assigned. This might be a bug.",in_R8);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AssignShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x135);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  *pDstShader = pSrcShader;
  return;
}

Assistant:

inline void AssignShader(IShader*& pDstShader, IShader* pSrcShader, SHADER_TYPE ExpectedType)
{
    VERIFY_EXPR(pSrcShader != nullptr);
    VERIFY_EXPR(pSrcShader->GetDesc().ShaderType == ExpectedType);

    VERIFY(pDstShader == nullptr, "Non-null ", GetShaderTypeLiteralName(pDstShader->GetDesc().ShaderType), " has already been assigned. This might be a bug.");
    pDstShader = pSrcShader;
}